

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3D.h
# Opt level: O2

bool __thiscall CMU462::StaticScene::Triangle::intersect(Triangle *this,Ray *r)

{
  double dVar1;
  Vector3D *pVVar2;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar7 = (r->d).x;
  dVar12 = (r->d).y;
  dVar1 = (r->d).z;
  pVVar2 = this->mesh->positions;
  sVar3 = this->v1;
  dVar6 = pVVar2[sVar3].x;
  dVar16 = pVVar2[sVar3].y;
  dVar18 = pVVar2[sVar3].z;
  sVar3 = this->v2;
  sVar4 = this->v3;
  dVar10 = pVVar2[sVar3].x - dVar6;
  dVar17 = pVVar2[sVar3].y - dVar16;
  dVar13 = pVVar2[sVar3].z - dVar18;
  dVar15 = pVVar2[sVar4].x - dVar6;
  dVar5 = pVVar2[sVar4].y - dVar16;
  dVar9 = dVar17 * dVar1 - dVar12 * dVar13;
  dVar14 = dVar13 * dVar7 - dVar1 * dVar10;
  dVar11 = dVar10 * dVar12 - dVar7 * dVar17;
  dVar20 = pVVar2[sVar4].z - dVar18;
  dVar8 = dVar11 * dVar20 + dVar9 * dVar15 + dVar14 * dVar5;
  if (1e-05 <= dVar8) {
    dVar6 = (r->o).x - dVar6;
    dVar16 = (r->o).y - dVar16;
    dVar18 = (r->o).z - dVar18;
    dVar19 = dVar16 * dVar20 - dVar5 * dVar18;
    dVar20 = dVar18 * dVar15 - dVar20 * dVar6;
    dVar5 = dVar6 * dVar5 - dVar15 * dVar16;
    dVar7 = -(dVar1 * dVar5 + dVar7 * dVar19 + dVar12 * dVar20) / dVar8;
    if ((((0.0 <= dVar7) && (dVar7 <= 1.0)) &&
        (dVar12 = (dVar11 * dVar18 + dVar9 * dVar6 + dVar16 * dVar14) / dVar8, 0.0 <= dVar12)) &&
       (((dVar12 + dVar7 <= 1.0 &&
         (dVar8 = -(dVar5 * dVar13 + dVar19 * dVar10 + dVar17 * dVar20) / dVar8,
         dVar8 < r->max_t || dVar8 == r->max_t)) && (r->min_t <= dVar8)))) {
      r->max_t = dVar8;
      return true;
    }
  }
  return false;
}

Assistant:

Vector3D( const Vector3D& v ) : x( v.x ), y( v.y ), z( v.z ) { }